

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent_dss.c
# Opt level: O1

_Bool duckdb_je_extent_dss_mergeable(void *addr_a,void *addr_b)

{
  bool bVar1;
  
  bVar1 = true;
  if (dss_base <= addr_a || dss_base <= addr_b) {
    bVar1 = (addr_b < dss_base || dss_max.repr <= addr_b) !=
            (addr_a < dss_max.repr && dss_base <= addr_a);
  }
  return bVar1;
}

Assistant:

bool
extent_dss_mergeable(void *addr_a, void *addr_b) {
	void *max;

	cassert(have_dss);

	if ((uintptr_t)addr_a < (uintptr_t)dss_base && (uintptr_t)addr_b <
	    (uintptr_t)dss_base) {
		return true;
	}

	max = atomic_load_p(&dss_max, ATOMIC_ACQUIRE);
	return (extent_in_dss_helper(addr_a, max) ==
	    extent_in_dss_helper(addr_b, max));
}